

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_JUnitOutputTest_withOneTestGroupAndOneFailingTest_TestShell::createTest
          (TEST_JUnitOutputTest_withOneTestGroupAndOneFailingTest_TestShell *this)

{
  TEST_JUnitOutputTest_withOneTestGroupAndOneFailingTest_Test *this_00;
  
  this_00 = (TEST_JUnitOutputTest_withOneTestGroupAndOneFailingTest_Test *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
                         ,0x1e4);
  TEST_JUnitOutputTest_withOneTestGroupAndOneFailingTest_Test::
  TEST_JUnitOutputTest_withOneTestGroupAndOneFailingTest_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(JUnitOutputTest, withOneTestGroupAndOneFailingTest)
{
    testCaseRunner->start()
            .withGroup("testGroupWithFailingTest")
                .withTest("FailingTestName").thatFails("Test failed", "thisfile", 10)
            .end();

    outputFile = fileSystem.file("cpputest_testGroupWithFailingTest.xml");
    STRCMP_EQUAL("<testsuite errors=\"0\" failures=\"1\" hostname=\"localhost\" name=\"testGroupWithFailingTest\" tests=\"1\" time=\"0.000\" timestamp=\"1978-10-03T00:00:00\">\n", outputFile->line(2));
    STRCMP_EQUAL("<testcase classname=\"testGroupWithFailingTest\" name=\"FailingTestName\" assertions=\"0\" time=\"0.000\" file=\"file\" line=\"1\">\n", outputFile->line(5));
    STRCMP_EQUAL("<failure message=\"thisfile:10: Test failed\" type=\"AssertionFailedError\">\n", outputFile->line(6));
    STRCMP_EQUAL("</failure>\n", outputFile->line(7));
    STRCMP_EQUAL("</testcase>\n", outputFile->line(8));
}